

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-opt.cpp
# Opt level: O0

void helper_after_test_gradient_accumulation
               (char *func,int nbatch_physical,ggml_opt_loss_type loss_type,int epoch,
               string *subtest,bool subtest_ok,int *ntest,int *npass)

{
  int in_EDX;
  char *pcVar1;
  string *in_R8;
  byte in_R9B;
  string options;
  allocator<char> *ntest_00;
  string local_e0 [7];
  undefined1 in_stack_ffffffffffffff27;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  int *in_stack_ffffffffffffff50;
  string local_a0 [32];
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [39];
  byte local_21;
  int local_10;
  
  local_21 = in_R9B & 1;
  ntest_00 = &local_49;
  local_10 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,
             (char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             (allocator<char> *)in_stack_ffffffffffffff30);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::to_string(in_stack_ffffffffffffff4c);
  std::__cxx11::string::operator+=(local_48,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::operator+=(local_48,", loss_type=");
  pcVar1 = "sum";
  if (local_10 == 0) {
    pcVar1 = "mean";
  }
  std::__cxx11::string::operator+=(local_48,pcVar1);
  std::__cxx11::string::operator+=(local_48,", epoch=");
  std::__cxx11::to_string(in_stack_ffffffffffffff4c);
  std::__cxx11::string::operator+=(local_48,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff40,local_48);
  std::__cxx11::string::string(local_e0,in_R8);
  helper_after_test((char *)in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f,
                    in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                    (bool)in_stack_ffffffffffffff27,(int *)ntest_00,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

static void helper_after_test_gradient_accumulation(
        const char * func, const int nbatch_physical, const enum ggml_opt_loss_type loss_type, const int epoch,
        const std::string subtest, const bool subtest_ok, int & ntest, int & npass) {
    std::string options = ", nbatch_physical=";
    options += std::to_string(nbatch_physical);
    options += ", loss_type=";
    options += loss_type == GGML_OPT_LOSS_TYPE_MEAN ? "mean" : "sum";
    options += ", epoch=";
    options += std::to_string(epoch);
    helper_after_test(func, false, options, subtest, subtest_ok, ntest, npass);
}